

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int mg_read(mg_connection *conn,void *buf,size_t len)

{
  int iVar1;
  ushort **ppuVar2;
  ulong uVar3;
  long lVar4;
  byte *buf_00;
  byte bVar5;
  long lVar6;
  uint uVar7;
  size_t len_00;
  char *end;
  char lenbuf [64];
  char *local_88;
  undefined8 local_80;
  byte local_78 [72];
  
  len_00 = 0x7fffffff;
  if (len < 0x7fffffff) {
    len_00 = len;
  }
  if (conn == (mg_connection *)0x0) {
    return 0;
  }
  if (conn->is_chunked == 0) {
    iVar1 = mg_read_inner(conn,buf,len_00);
    return iVar1;
  }
  lVar6 = 0;
  local_80 = buf;
  if (len != 0) {
    do {
      if (2 < conn->is_chunked) {
        return 0;
      }
      if (conn->is_chunked != 1) {
        return -1;
      }
      if (conn->consumed_content == conn->content_len) {
        local_88 = (char *)0x0;
        lVar4 = 0;
        do {
          conn->content_len = conn->content_len + 1;
          buf_00 = local_78 + lVar4;
          iVar1 = mg_read_inner(conn,buf_00,1);
          if (iVar1 == 1) {
            bVar5 = local_78[lVar4];
            if (lVar4 == 0) goto LAB_0010df2f;
            if (bVar5 == 0x3b) {
              do {
                conn->content_len = conn->content_len + 1;
                iVar1 = mg_read_inner(conn,buf_00,1);
                bVar5 = *buf_00;
                if (iVar1 != 1) goto LAB_0010def9;
              } while (bVar5 != 0xd);
            }
            else {
LAB_0010def9:
              if (bVar5 != 0xd) goto LAB_0010df0f;
            }
            bVar5 = 0xd;
            if (local_78[lVar4 + -1] == 0xd) goto LAB_0010df0f;
          }
          else {
            bVar5 = 0;
            local_78[lVar4] = 0;
            if (lVar4 != 0) {
LAB_0010df0f:
              if (((lVar4 != 1) && (bVar5 == 10)) && (bVar5 = 10, local_78[lVar4 + -1] == 0xd)) {
                local_78[lVar4 + 1] = 0;
                uVar3 = strtoul((char *)local_78,&local_88,0x10);
                if (uVar3 != 0) goto LAB_0010df55;
                conn->is_chunked = 3;
                break;
              }
            }
LAB_0010df2f:
            ppuVar2 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar2 + (ulong)bVar5 * 2 + 1) & 0x10) == 0) goto LAB_0010e04e;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x3f);
        uVar3 = 0;
LAB_0010df55:
        if ((local_88 == (char *)0x0) || (*local_88 != '\r')) goto LAB_0010e04e;
        if (conn->is_chunked == 3) {
          uVar7 = 2;
          goto LAB_0010e068;
        }
        conn->content_len = conn->content_len + uVar3;
        buf = local_80;
      }
      else {
        uVar7 = mg_read_inner(conn,(void *)((long)buf + lVar6),len_00);
        if ((int)uVar7 < 1) {
LAB_0010e04e:
          conn->is_chunked = 2;
          return -1;
        }
        lVar6 = lVar6 + (ulong)uVar7;
        len_00 = len_00 - uVar7;
        if (conn->consumed_content == conn->content_len) {
          conn->content_len = conn->consumed_content + 2;
          iVar1 = mg_read_inner(conn,local_78,2);
          if (((iVar1 != 2) || (local_78[0] != 0xd)) || (local_78[1] != '\n')) goto LAB_0010e04e;
        }
      }
    } while (len_00 != 0);
  }
  goto LAB_0010e0d5;
LAB_0010e068:
  do {
    conn->content_len = conn->content_len + 1;
    iVar1 = mg_read_inner(conn,local_78,1);
    if (iVar1 == 1) {
      if ((uVar7 & 0xfffffffd) == 0) {
        uVar7 = uVar7 | 1;
        if (local_78[0] != 0xd) {
          uVar7 = 0;
        }
      }
      else {
        if (local_78[0] != 10) goto LAB_0010e0a0;
        if (2 < (int)uVar7) {
          iVar1 = conn->is_chunked;
          break;
        }
        uVar7 = uVar7 + 1;
      }
    }
    else {
LAB_0010e0a0:
      conn->is_chunked = 2;
    }
    iVar1 = conn->is_chunked;
  } while (iVar1 == 3);
  if (iVar1 == 2) {
    return -1;
  }
  conn->is_chunked = 4;
LAB_0010e0d5:
  return (int)lVar6;
}

Assistant:

CIVETWEB_API int
mg_read(struct mg_connection *conn, void *buf, size_t len)
{
	if (len > INT_MAX) {
		len = INT_MAX;
	}

	if (conn == NULL) {
		return 0;
	}

	if (conn->is_chunked) {
		size_t all_read = 0;

		while (len > 0) {
			if (conn->is_chunked >= 3) {
				/* No more data left to read */
				return 0;
			}
			if (conn->is_chunked != 1) {
				/* Has error */
				return -1;
			}

			if (conn->consumed_content != conn->content_len) {
				/* copy from the current chunk */
				int read_ret = mg_read_inner(conn, (char *)buf + all_read, len);

				if (read_ret < 1) {
					/* read error */
					conn->is_chunked = 2;
					return -1;
				}

				all_read += (size_t)read_ret;
				len -= (size_t)read_ret;

				if (conn->consumed_content == conn->content_len) {
					/* Add data bytes in the current chunk have been read,
					 * so we are expecting \r\n now. */
					char x[2];
					conn->content_len += 2;
					if ((mg_read_inner(conn, x, 2) != 2) || (x[0] != '\r')
					    || (x[1] != '\n')) {
						/* Protocol violation */
						conn->is_chunked = 2;
						return -1;
					}
				}

			} else {
				/* fetch a new chunk */
				size_t i;
				char lenbuf[64];
				char *end = NULL;
				unsigned long chunkSize = 0;

				for (i = 0; i < (sizeof(lenbuf) - 1); i++) {
					conn->content_len++;
					if (mg_read_inner(conn, lenbuf + i, 1) != 1) {
						lenbuf[i] = 0;
					}
					if ((i > 0) && (lenbuf[i] == ';')) {
						// chunk extension --> skip chars until next CR
						//
						// RFC 2616, 3.6.1 Chunked Transfer Coding
						// (https://www.rfc-editor.org/rfc/rfc2616#page-25)
						//
						// chunk          = chunk-size [ chunk-extension ] CRLF
						//                  chunk-data CRLF
						// ...
						// chunk-extension= *( ";" chunk-ext-name [ "="
						// chunk-ext-val ] )
						do
							++conn->content_len;
						while (mg_read_inner(conn, lenbuf + i, 1) == 1
						       && lenbuf[i] != '\r');
					}
					if ((i > 0) && (lenbuf[i] == '\r')
					    && (lenbuf[i - 1] != '\r')) {
						continue;
					}
					if ((i > 1) && (lenbuf[i] == '\n')
					    && (lenbuf[i - 1] == '\r')) {
						lenbuf[i + 1] = 0;
						chunkSize = strtoul(lenbuf, &end, 16);
						if (chunkSize == 0) {
							/* regular end of content */
							conn->is_chunked = 3;
						}
						break;
					}
					if (!isxdigit((unsigned char)lenbuf[i])) {
						/* illegal character for chunk length */
						conn->is_chunked = 2;
						return -1;
					}
				}
				if ((end == NULL) || (*end != '\r')) {
					/* chunksize not set correctly */
					conn->is_chunked = 2;
					return -1;
				}
				if (conn->is_chunked == 3) {
					/* try discarding trailer for keep-alive */

					// We found the last chunk (length 0) including the
					// CRLF that terminates that chunk. Now follows a possibly
					// empty trailer and a final CRLF.
					//
					// see RFC 2616, 3.6.1 Chunked Transfer Coding
					// (https://www.rfc-editor.org/rfc/rfc2616#page-25)
					//
					// Chunked-Body   = *chunk
					// 	                last-chunk
					// 	                trailer
					// 	                CRLF
					// ...
					// last-chunk     = 1*("0") [ chunk-extension ] CRLF
					// ...
					// trailer        = *(entity-header CRLF)

					int crlf_count = 2; // one CRLF already determined

					while (crlf_count < 4 && conn->is_chunked == 3) {
						++conn->content_len;
						if (mg_read_inner(conn, lenbuf, 1) == 1) {
							if ((crlf_count == 0 || crlf_count == 2)) {
								if (lenbuf[0] == '\r')
									++crlf_count;
								else
									crlf_count = 0;
							} else {
								// previous character was a CR
								// --> next character must be LF

								if (lenbuf[0] == '\n')
									++crlf_count;
								else
									conn->is_chunked = 2;
							}
						} else
							// premature end of trailer
							conn->is_chunked = 2;
					}

					if (conn->is_chunked == 2)
						return -1;
					else
						conn->is_chunked = 4;

					break;
				}

				/* append a new chunk */
				conn->content_len += (int64_t)chunkSize;
			}
		}

		return (int)all_read;
	}
	return mg_read_inner(conn, buf, len);
}